

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O1

XMLElement * CS248::Collada::ColladaParser::get_technique_common(XMLElement *xml)

{
  int iVar1;
  XMLElement *pXVar2;
  char *pcVar3;
  XMLElement *pXVar4;
  XMLElement *this;
  XMLElement *unaff_R15;
  string sid;
  allocator local_59;
  XMLElement *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pXVar2 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"profile_COMMON");
  if (pXVar2 != (XMLElement *)0x0) {
    local_58 = xml;
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar2->super_XMLNode,"technique");
    do {
      this = pXVar2;
      pXVar4 = unaff_R15;
      if (this == (XMLElement *)0x0) break;
      pcVar3 = tinyxml2::XMLElement::Attribute(this,"sid",(char *)0x0);
      std::__cxx11::string::string((string *)local_50,pcVar3,&local_59);
      iVar1 = std::__cxx11::string::compare((char *)local_50);
      pXVar4 = this;
      pXVar2 = this;
      if (iVar1 != 0) {
        pXVar2 = tinyxml2::XMLNode::NextSiblingElement(&this->super_XMLNode,"technique");
        pXVar4 = unaff_R15;
      }
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      unaff_R15 = pXVar4;
    } while (iVar1 != 0);
    xml = local_58;
    if (this != (XMLElement *)0x0) {
      return pXVar4;
    }
  }
  pXVar2 = tinyxml2::XMLNode::FirstChildElement(&xml->super_XMLNode,"technique_common");
  return pXVar2;
}

Assistant:

XMLElement* ColladaParser::get_technique_common(XMLElement* xml) {
  XMLElement* common_profile = xml->FirstChildElement("profile_COMMON");
  if (common_profile) {
    XMLElement* technique = common_profile->FirstChildElement("technique");
    while (technique) {
      string sid = technique->Attribute("sid");
      if (sid == "common") return technique;
      technique = technique->NextSiblingElement("technique");
    }
  }

  return xml->FirstChildElement("technique_common");
}